

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

bool __thiscall GrcFont::IsGraphiteFont(GrcFont *this,void *pHdr,void *pTableDir)

{
  bool bVar1;
  bool bVar2;
  size_t lnSize;
  size_t lnOffset;
  
  bVar1 = TtfUtil::GetTableInfo(ktiSilf,pHdr,pTableDir,&lnOffset,&lnSize);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = TtfUtil::GetTableInfo(ktiGloc,pHdr,pTableDir,&lnOffset,&lnSize);
    if (!bVar1) {
      bVar1 = TtfUtil::GetTableInfo(ktiGlat,pHdr,pTableDir,&lnOffset,&lnSize);
      if (!bVar1) {
        bVar2 = TtfUtil::GetTableInfo(ktiFeat,pHdr,pTableDir,&lnOffset,&lnSize);
      }
    }
  }
  return bVar2;
}

Assistant:

bool GrcFont::IsGraphiteFont(void * pHdr, void * pTableDir)
{
	size_t lnOffset, lnSize;

	if (TtfUtil::GetTableInfo(ktiSilf, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGloc, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGlat, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiFeat, pHdr, pTableDir, lnOffset, lnSize))
		return true;

	return false;
}